

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O1

_Bool duckdb_je_tsd_tcache_data_init
                (tsd_t *tsd,arena_t *arena,cache_bin_info_t *duckdb_je_tcache_bin_info)

{
  long *plVar1;
  rtree_ctx_cache_elm_t *prVar2;
  tcache_slow_t *tsd_00;
  undefined8 *puVar3;
  void *pvVar4;
  rtree_leaf_elm_t *prVar5;
  _Bool _Var6;
  undefined1 uVar7;
  undefined1 extraout_AL;
  tcache_t *tcache_00;
  ulong uVar8;
  rtree_leaf_elm_t *prVar9;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  atomic_p_t arena_00;
  arena_t *paVar11;
  arena_t *extraout_RAX_01;
  arena_t *extraout_RAX_02;
  ulong uVar12;
  rtree_ctx_cache_elm_t *prVar13;
  rtree_ctx_cache_elm_t *in_R8;
  rtree_ctx_cache_elm_t *prVar14;
  uint uVar15;
  tcache_slow_t *tcache_slow;
  rtree_ctx_t *prVar16;
  tcache_t *tcache;
  rtree_leaf_elm_t *prVar17;
  bool bVar18;
  size_t alignment;
  size_t size;
  rtree_ctx_t rtree_ctx_fallback;
  ulong local_1c0;
  size_t local_1b8;
  rtree_ctx_t local_1b0;
  tcache_t *ptVar10;
  
  duckdb_je_cache_bin_info_compute_alloc
            (duckdb_je_tcache_bin_info,
             (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow).tcache_nbins,
             &local_1b8,&local_1c0);
  _Var6 = duckdb_je_cache_bin_stack_use_thp();
  if (_Var6) {
    tcache_00 = (tcache_t *)duckdb_je_b0_alloc_tcache_stack((tsdn_t *)tsd,local_1b8);
    ptVar10 = tcache_00;
  }
  else {
    if ((0x1000 < local_1c0 || 0x3800 < local_1b8) ||
       (duckdb_je_tsd_tcache_data_init_cold_1(), uVar12 = local_1b0.cache[0].leafkey,
       (extraout_RAX & 1) == 0)) {
      if ((local_1c0 < 0x7000000000000001) &&
         ((uVar8 = 0x4000, local_1b8 < 0x4001 ||
          (duckdb_je_tsd_tcache_data_init_cold_2(), uVar8 = local_1b0.cache[0].leafkey,
          (extraout_RAX_00 & 1) == 0)))) {
        uVar12 = 0;
        if (uVar8 <= (duckdb_je_sz_large_pad + (local_1c0 + 0xfff & 0x7ffffffffffff000) + uVar8) -
                     0x1000) {
          uVar12 = uVar8;
        }
      }
      else {
        uVar12 = 0;
      }
    }
    arena_00.repr = duckdb_je_arenas[0].repr;
    local_1b8 = uVar12;
    if (duckdb_je_arenas[0].repr == (void *)0x0) {
      arena_00.repr = duckdb_je_arena_init((tsdn_t *)0x0,0,&duckdb_je_arena_config_default);
    }
    in_R8 = (rtree_ctx_cache_elm_t *)&DAT_00000001;
    tcache_00 = (tcache_t *)
                duckdb_je_arena_palloc
                          ((tsdn_t *)tsd,(arena_t *)arena_00.repr,uVar12,local_1c0,true,
                           uVar12 < 0x3801,(tcache_t *)0x0);
    ptVar10 = tcache_00;
    if (tcache_00 != (tcache_t *)0x0) {
      if (tsd == (tsd_t *)0x0) {
        prVar16 = &local_1b0;
        duckdb_je_rtree_ctx_data_init(prVar16);
      }
      else {
        prVar16 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      }
      uVar15 = (uint)((ulong)tcache_00 >> 0x1e) & 0xf;
      prVar17 = (rtree_leaf_elm_t *)((ulong)tcache_00 & 0xffffffffc0000000);
      uVar12 = (ulong)(uVar15 << 4);
      puVar3 = (undefined8 *)((long)&prVar16->cache[0].leafkey + uVar12);
      prVar9 = *(rtree_leaf_elm_t **)((long)&prVar16->cache[0].leafkey + uVar12);
      prVar14 = in_R8;
      if (prVar9 == prVar17) {
        prVar9 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)tcache_00 >> 9) & 0x1ffff8) + puVar3[1])
        ;
      }
      else if ((rtree_leaf_elm_t *)prVar16->l2_cache[0].leafkey == prVar17) {
        prVar5 = prVar16->l2_cache[0].leaf;
        prVar16->l2_cache[0].leafkey = (uintptr_t)prVar9;
        prVar16->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar3[1];
        *puVar3 = prVar17;
        puVar3[1] = prVar5;
        prVar9 = (rtree_leaf_elm_t *)
                 ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)tcache_00 >> 9) & 0x1ffff8))
        ;
      }
      else {
        prVar14 = prVar16->l2_cache + 1;
        if ((rtree_leaf_elm_t *)prVar16->l2_cache[1].leafkey == prVar17) {
          uVar12 = 0;
          bVar18 = false;
        }
        else {
          uVar12 = 0;
          prVar13 = prVar14;
          prVar14 = in_R8;
          do {
            if (uVar12 == 6) {
              bVar18 = true;
              goto LAB_01c90cfc;
            }
            prVar14 = prVar13 + 1;
            uVar12 = uVar12 + 1;
            prVar2 = prVar13 + 1;
            prVar13 = prVar14;
          } while ((rtree_leaf_elm_t *)prVar2->leafkey != prVar17);
          bVar18 = 6 < uVar12;
        }
        prVar13 = prVar16->l2_cache;
        prVar5 = prVar14->leaf;
        prVar14->leafkey = prVar13[uVar12].leafkey;
        prVar14->leaf = prVar16->l2_cache[uVar12].leaf;
        prVar13[uVar12].leafkey = (uintptr_t)prVar9;
        prVar16->l2_cache[uVar12].leaf = (rtree_leaf_elm_t *)puVar3[1];
        *puVar3 = prVar17;
        puVar3[1] = prVar5;
        prVar9 = (rtree_leaf_elm_t *)
                 ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)tcache_00 >> 9) & 0x1ffff8))
        ;
        prVar14 = prVar13;
LAB_01c90cfc:
        if (bVar18) {
          prVar14 = (rtree_ctx_cache_elm_t *)&DAT_00000001;
          prVar9 = duckdb_je_rtree_leaf_elm_lookup_hard
                             ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar16,
                              (uintptr_t)tcache_00,true,false);
        }
      }
      pvVar4 = duckdb_je_arenas
               [*(uint *)(((long)(prVar9->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80) &
                0xfff].repr;
      if (tsd == (tsd_t *)0x0) {
        prVar16 = &local_1b0;
        duckdb_je_rtree_ctx_data_init(prVar16);
      }
      else {
        prVar16 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      }
      uVar12 = (ulong)(uVar15 << 4);
      puVar3 = (undefined8 *)((long)&prVar16->cache[0].leafkey + uVar12);
      prVar9 = *(rtree_leaf_elm_t **)((long)&prVar16->cache[0].leafkey + uVar12);
      in_R8 = prVar14;
      if (prVar9 == prVar17) {
        prVar9 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)tcache_00 >> 9) & 0x1ffff8) + puVar3[1])
        ;
      }
      else if ((rtree_leaf_elm_t *)prVar16->l2_cache[0].leafkey == prVar17) {
        prVar5 = prVar16->l2_cache[0].leaf;
        prVar16->l2_cache[0].leafkey = (uintptr_t)prVar9;
        prVar16->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar3[1];
        *puVar3 = prVar17;
        puVar3[1] = prVar5;
        prVar9 = (rtree_leaf_elm_t *)
                 ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)tcache_00 >> 9) & 0x1ffff8))
        ;
      }
      else {
        in_R8 = prVar16->l2_cache + 1;
        if ((rtree_leaf_elm_t *)prVar16->l2_cache[1].leafkey == prVar17) {
          uVar12 = 0;
          bVar18 = false;
        }
        else {
          uVar12 = 0;
          prVar13 = in_R8;
          in_R8 = prVar14;
          do {
            if (uVar12 == 6) {
              bVar18 = true;
              goto LAB_01c90d80;
            }
            in_R8 = prVar13 + 1;
            uVar12 = uVar12 + 1;
            prVar14 = prVar13 + 1;
            prVar13 = in_R8;
          } while ((rtree_leaf_elm_t *)prVar14->leafkey != prVar17);
          bVar18 = 6 < uVar12;
        }
        prVar14 = prVar16->l2_cache;
        prVar5 = in_R8->leaf;
        in_R8->leafkey = prVar14[uVar12].leafkey;
        in_R8->leaf = prVar16->l2_cache[uVar12].leaf;
        prVar14[uVar12].leafkey = (uintptr_t)prVar9;
        prVar16->l2_cache[uVar12].leaf = (rtree_leaf_elm_t *)puVar3[1];
        *puVar3 = prVar17;
        puVar3[1] = prVar5;
        prVar9 = (rtree_leaf_elm_t *)
                 ((long)&(prVar5->le_bits).repr + (ulong)((uint)((ulong)tcache_00 >> 9) & 0x1ffff8))
        ;
        in_R8 = prVar14;
LAB_01c90d80:
        if (bVar18) {
          in_R8 = (rtree_ctx_cache_elm_t *)&DAT_00000001;
          prVar9 = duckdb_je_rtree_leaf_elm_lookup_hard
                             ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,prVar16,
                              (uintptr_t)tcache_00,true,false);
        }
      }
      ptVar10 = (tcache_t *)duckdb_je_sz_index2size_tab[(ulong)(prVar9->le_bits).repr >> 0x30];
      LOCK();
      plVar1 = (long *)((long)pvVar4 + 0x48);
      *plVar1 = (long)ptVar10->bins + *plVar1 + -8;
      UNLOCK();
    }
  }
  uVar7 = SUB81(ptVar10,0);
  if (tcache_00 != (tcache_t *)0x0) {
    tsd_00 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow;
    ptVar10 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
    tcache_init((tsd_t *)tsd_00,(tcache_slow_t *)ptVar10,tcache_00,duckdb_je_tcache_bin_info,
                (cache_bin_info_t *)in_R8);
    (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow).arena = (arena_t *)0x0;
    if (duckdb_je_malloc_init_state == malloc_init_initialized) {
      paVar11 = (arena_t *)&duckdb_je_malloc_init_state;
      if (arena == (arena_t *)0x0) {
        if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level < '\x01') {
          arena = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_arena;
          if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_arena == (arena_t *)0x0)
             && (arena = duckdb_je_arena_choose_hard(tsd,false), paVar11 = arena,
                tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == true))
          {
            paVar11 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow).arena
            ;
            if (paVar11 == (arena_t *)0x0) {
              duckdb_je_tcache_arena_associate((tsdn_t *)tsd,tsd_00,ptVar10,arena);
              paVar11 = extraout_RAX_02;
            }
            else if (paVar11 != arena) {
              duckdb_je_tcache_arena_reassociate((tsdn_t *)tsd,tsd_00,ptVar10,arena);
              paVar11 = extraout_RAX_01;
            }
          }
        }
        else {
          paVar11 = (arena_t *)duckdb_je_arenas;
          arena = (arena_t *)duckdb_je_arenas[0];
          if (duckdb_je_arenas[0].repr == (void *)0x0) {
            paVar11 = duckdb_je_arena_init((tsdn_t *)tsd,0,&duckdb_je_arena_config_default);
            arena = paVar11;
          }
        }
      }
      if ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow).arena !=
          (arena_t *)0x0) {
        return (_Bool)(char)paVar11;
      }
    }
    else {
      arena = (arena_t *)duckdb_je_arenas[0];
      if (duckdb_je_arenas[0].repr == (void *)0x0) {
        arena = (arena_t *)0x0;
      }
    }
    duckdb_je_tcache_arena_associate((tsdn_t *)tsd,tsd_00,ptVar10,arena);
    uVar7 = extraout_AL;
  }
  return (_Bool)uVar7;
}

Assistant:

static bool
tsd_tcache_data_init(tsd_t *tsd, arena_t *arena,
    const cache_bin_info_t tcache_bin_info[TCACHE_NBINS_MAX]) {
	assert(tcache_bin_info != NULL);
	return tsd_tcache_data_init_impl(tsd, arena, tcache_bin_info);
}